

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseStmt(Parser *this)

{
  bool bVar1;
  Parser *in_RSI;
  ParseError *error;
  Parser *this_local;
  
  bVar1 = consume(in_RSI,FUNC);
  if (bVar1) {
    parseFunctionStmt(this,SUB81(in_RSI,0));
  }
  else {
    bVar1 = consume(in_RSI,STRUCT);
    if (bVar1) {
      parseStructStmt(this);
    }
    else {
      bVar1 = consume(in_RSI,ENUM);
      if (bVar1) {
        parseEnumStmt(this);
      }
      else {
        bVar1 = consume(in_RSI,TRAIT);
        if (bVar1) {
          parseTraitStmt(this);
        }
        else {
          bVar1 = consume(in_RSI,IMPL);
          if (bVar1) {
            parseImplStmt(this);
          }
          else {
            bVar1 = consume(in_RSI,IMM);
            if ((!bVar1) && (bVar1 = consume(in_RSI,MUT), !bVar1)) {
              bVar1 = consume(in_RSI,RETURN);
              if (bVar1) {
                parseReturnStmt(this);
                return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
                       (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
                       this;
              }
              bVar1 = consume(in_RSI,BREAK);
              if (!bVar1) {
                bVar1 = consume(in_RSI,CONTINUE);
                if (!bVar1) {
                  parseExpressionStmt(this);
                  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>
                         )(__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>
                           )this;
                }
                parseContinueStmt(this);
                return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
                       (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
                       this;
              }
              parseBreakStmt(this);
              return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
                     (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
                     this;
            }
            parseVariableStmt(this);
          }
        }
      }
    }
  }
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseStmt() {
        try {
            if (consume(TokenType::FUNC))     return parseFunctionStmt();
            if (consume(TokenType::STRUCT))   return parseStructStmt();
            if (consume(TokenType::ENUM))     return parseEnumStmt();
            if (consume(TokenType::TRAIT))    return parseTraitStmt();
            if (consume(TokenType::IMPL))     return parseImplStmt();
            if (consume(TokenType::IMM) ||
                consume(TokenType::MUT))      return parseVariableStmt();
            if (consume(TokenType::RETURN))   return parseReturnStmt();
            if (consume(TokenType::BREAK))    return parseBreakStmt();
            if (consume(TokenType::CONTINUE)) return parseContinueStmt();
            return parseExpressionStmt();
        } catch (ParseError &error) {
            synchronise();
            return nullptr;
        }
    }